

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_optTests.cpp
# Opt level: O1

void __thiscall
shared_guarded_opt_shared_guarded_1_Test::TestBody(shared_guarded_opt_shared_guarded_1_Test *this)

{
  char *pcVar1;
  char *in_R9;
  pointer *__ptr;
  pthread_rwlock_t *__rwlock;
  pointer *__ptr_8;
  bool bVar2;
  atomic<bool> th2_ok;
  atomic<bool> th1_ok;
  atomic<bool> th3_ok;
  thread th1;
  handle data_handle;
  atomic<bool> th1_ok_2;
  AssertionResult gtest_ar_;
  thread th3;
  thread th2;
  handle data_handle_1;
  shared_guarded_opt<int,_std::shared_timed_mutex> data;
  byte local_f2;
  byte local_f1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  byte local_e1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  undefined1 local_d8 [8];
  undefined1 local_d0 [24];
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertHelper local_98;
  undefined1 local_90 [8];
  unique_lock<std::shared_timed_mutex> local_88;
  shared_guarded_opt<int,_std::shared_timed_mutex> local_78;
  
  local_78.m_obj = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock.__align = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock._8_8_ = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock._16_8_ = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock._24_8_ = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock._32_8_ = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock.__data.__pad2 = 0;
  local_78.m_mutex.super___shared_timed_mutex_base._M_rwlock._48_8_ = 0;
  local_78.enabled = true;
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::lock
            ((handle *)local_d8,&local_78);
  *(int *)local_d8 = *(int *)local_d8 + 1;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock
            ((unique_lock<std::shared_timed_mutex> *)local_d0);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock
            ((handle *)local_90,&local_78);
  bVar2 = CONCAT44(local_90._4_4_,local_90._0_4_) != 0;
  local_b0._M_head_impl._0_1_ = bVar2;
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)0x1542ad,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x2e,(char *)local_d8);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
      operator_delete((void *)local_d8,local_d0._8_8_ + 1);
    }
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_b0._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_d8,"*data_handle","1",(int *)CONCAT44(local_90._4_4_,local_90._0_4_),
             (int *)&local_b0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((_Alloc_hider *)local_d0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_
                );
  }
  local_f1 = 1;
  local_f2 = 1;
  local_e1 = 1;
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8 = (undefined1  [8])operator_new(0x18);
  *(undefined ***)local_d8 = &PTR___State_00176698;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
  *(byte **)((long)local_d8 + 0x10) = &local_f1;
  std::thread::_M_start_thread(&local_e0,local_d8,0);
  if (local_d8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_d8 + 8))();
  }
  local_98.data_ = (AssertHelperData *)0x0;
  local_d8 = (undefined1  [8])operator_new(0x18);
  *(undefined ***)local_d8 = &PTR___State_001766d8;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
  *(byte **)((long)local_d8 + 0x10) = &local_f2;
  std::thread::_M_start_thread(&local_98,local_d8,0);
  if (local_d8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_d8 + 8))();
  }
  local_a0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_d8 = (undefined1  [8])operator_new(0x18);
  *(undefined ***)local_d8 = &PTR___State_00176718;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
  *(byte **)((long)local_d8 + 0x10) = &local_e1;
  std::thread::_M_start_thread(&local_a0,local_d8,0);
  if (local_d8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_d8 + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_b0._M_head_impl._1_7_,local_f1) & 0xffffffffffffff01);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_f1 & 1) == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)"th1_ok == true","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x54,(char *)local_d8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
      operator_delete((void *)local_d8,local_d0._8_8_ + 1);
    }
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_b0._M_head_impl._1_7_,local_f2) & 0xffffffffffffff01);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_f2 & 1) == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)"th2_ok == true","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x55,(char *)local_d8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
      operator_delete((void *)local_d8,local_d0._8_8_ + 1);
    }
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_b0._M_head_impl._1_7_,local_e1) & 0xffffffffffffff01);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_e1 & 1) == 0) {
    testing::Message::Message((Message *)&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)"th3_ok == true","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x56,(char *)local_d8);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
      operator_delete((void *)local_d8,local_d0._8_8_ + 1);
    }
    if (local_f0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_f0._M_head_impl + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  if (((local_a0._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (local_98.data_ == (AssertHelperData *)0x0)) &&
     (local_e0._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    std::unique_lock<std::shared_timed_mutex>::~unique_lock
              ((unique_lock<std::shared_timed_mutex> *)(local_90 + 8));
    gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock
              ((handle *)local_90,&local_78);
    bVar2 = CONCAT44(local_90._4_4_,local_90._0_4_) != 0;
    local_b0._M_head_impl._0_1_ = bVar2;
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (!bVar2) {
      testing::Message::Message((Message *)&local_e0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)0x1542ad,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                 ,0x5c,(char *)local_d8);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_e0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
        operator_delete((void *)local_d8,local_d0._8_8_ + 1);
      }
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_e0._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_b0._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_d8,"*data_handle","1",
               (int *)CONCAT44(local_90._4_4_,local_90._0_4_),(int *)&local_b0);
    if (local_d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((_Alloc_hider *)local_d0._0_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                 ,0x5d,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_d0._0_8_);
    }
    local_f1 = 1;
    local_f2 = 1;
    local_e1 = 1;
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_d8 = (undefined1  [8])operator_new(0x18);
    *(undefined ***)local_d8 = &PTR___State_00176758;
    *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
    *(byte **)((long)local_d8 + 0x10) = &local_f1;
    std::thread::_M_start_thread(&local_e0,local_d8,0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    local_98.data_ = (AssertHelperData *)0x0;
    local_d8 = (undefined1  [8])operator_new(0x18);
    *(undefined ***)local_d8 = &PTR___State_00176798;
    *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
    *(byte **)((long)local_d8 + 0x10) = &local_f2;
    std::thread::_M_start_thread(&local_98,local_d8,0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    local_a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_d8 = (undefined1  [8])operator_new(0x18);
    *(undefined ***)local_d8 = &PTR___State_001767d8;
    *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
    *(byte **)((long)local_d8 + 0x10) = &local_e1;
    std::thread::_M_start_thread(&local_a0,local_d8,0);
    if (local_d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_d8 + 8))();
    }
    std::thread::join();
    std::thread::join();
    std::thread::join();
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_b0._M_head_impl._1_7_,local_f1) & 0xffffffffffffff01);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((local_f1 & 1) == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)"th1_ok == true",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                 ,0x7f,(char *)local_d8);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
        operator_delete((void *)local_d8,local_d0._8_8_ + 1);
      }
      if (local_f0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f0._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_b0._M_head_impl._1_7_,local_f2) & 0xffffffffffffff01);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((local_f2 & 1) == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)"th2_ok == true",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                 ,0x80,(char *)local_d8);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
        operator_delete((void *)local_d8,local_d0._8_8_ + 1);
      }
      if (local_f0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f0._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_b0._M_head_impl._1_7_,local_e1) & 0xffffffffffffff01);
    local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((local_e1 & 1) == 0) {
      testing::Message::Message((Message *)&local_f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_d8,(internal *)&local_b0,(AssertionResult *)"th3_ok == true",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                 ,0x81,(char *)local_d8);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
        operator_delete((void *)local_d8,local_d0._8_8_ + 1);
      }
      if (local_f0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_f0._M_head_impl + 8))();
      }
    }
    if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_a8,local_a8);
    }
    if (((local_a0._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (local_98.data_ == (AssertHelperData *)0x0)) &&
       (local_e0._M_head_impl ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      std::unique_lock<std::shared_timed_mutex>::~unique_lock
                ((unique_lock<std::shared_timed_mutex> *)(local_90 + 8));
      bVar2 = local_78.enabled;
      if (local_78.enabled == true) {
        __rwlock = (pthread_rwlock_t *)&local_78.m_mutex;
        std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
      }
      else {
        __rwlock = (pthread_rwlock_t *)0x0;
      }
      local_90._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_d8,"*data_handle","1",&local_78.m_obj,(int *)local_90);
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_90);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((_Alloc_hider *)local_d0._0_8_)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                   ,0x88,pcVar1);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_90);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
        if ((long *)CONCAT44(local_90._4_4_,local_90._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_90._4_4_,local_90._0_4_) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_d0._0_8_);
      }
      local_b8.data_._0_1_ = 1;
      local_f1 = 1;
      local_f2 = 1;
      local_b0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_d8 = (undefined1  [8])operator_new(0x18);
      *(undefined ***)local_d8 = &PTR___State_00176818;
      *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
      *(AssertHelper **)((long)local_d8 + 0x10) = &local_b8;
      std::thread::_M_start_thread(&local_b0,local_d8,0);
      if (local_d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_d8 + 8))();
      }
      local_e0._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_d8 = (undefined1  [8])operator_new(0x18);
      *(undefined ***)local_d8 = &PTR___State_00176858;
      *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
      *(byte **)((long)local_d8 + 0x10) = &local_f1;
      std::thread::_M_start_thread(&local_e0,local_d8,0);
      if (local_d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_d8 + 8))();
      }
      local_98.data_ = (AssertHelperData *)0x0;
      local_d8 = (undefined1  [8])operator_new(0x18);
      *(undefined ***)local_d8 = &PTR___State_00176898;
      *(shared_guarded_opt<int,_std::shared_timed_mutex> **)((long)local_d8 + 8) = &local_78;
      *(byte **)((long)local_d8 + 0x10) = &local_f2;
      std::thread::_M_start_thread(&local_98,local_d8,0);
      if (local_d8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_d8 + 8))();
      }
      std::thread::join();
      std::thread::join();
      std::thread::join();
      local_90._0_4_ = CONCAT31(local_90._1_3_,(byte)local_b8.data_) & 0xffffff01;
      local_88._M_device = (mutex_type *)0x0;
      if (((byte)local_b8.data_ & 1) == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_90,(AssertionResult *)"th1_ok == true",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                   ,0xb3,(char *)local_d8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
          operator_delete((void *)local_d8,local_d0._8_8_ + 1);
        }
        if (local_a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._M_device !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_90 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_88._M_device);
      }
      local_90._0_4_ = CONCAT31(local_90._1_3_,local_f1) & 0xffffff01;
      local_88._M_device = (mutex_type *)0x0;
      if ((local_f1 & 1) == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_90,(AssertionResult *)"th2_ok == true",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                   ,0xb4,(char *)local_d8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
          operator_delete((void *)local_d8,local_d0._8_8_ + 1);
        }
        if (local_a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._M_device !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_90 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_88._M_device);
      }
      local_90._0_4_ = CONCAT31(local_90._1_3_,local_f2) & 0xffffff01;
      local_88._M_device = (mutex_type *)0x0;
      if ((local_f2 & 1) == 0) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_d8,(internal *)local_90,(AssertionResult *)"th3_ok == true",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
                   ,0xb5,(char *)local_d8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f0,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f0);
        if (local_d8 != (undefined1  [8])(local_d0 + 8)) {
          operator_delete((void *)local_d8,local_d0._8_8_ + 1);
        }
        if (local_a0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88._M_device !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_90 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_88._M_device);
      }
      if (((local_98.data_ == (AssertHelperData *)0x0) &&
          (local_e0._M_head_impl ==
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) &&
         (local_b0._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        if (bVar2 != false) {
          pthread_rwlock_unlock(__rwlock);
        }
        return;
      }
    }
  }
  std::terminate();
}

Assistant:

TEST(shared_guarded_opt, shared_guarded_1)
{
    shared_guarded_opt<int, shared_mutex> data(true, 0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        /* These tests must be done from another thread, because on
           glibc std::mutex is actually a recursive mutex. */

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_until(std::chrono::steady_clock::now() +
                                    std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (!data_handle2) {
                th1_ok = false;
            }
            if (*data_handle2 != 1) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (!data_handle2) {
                th2_ok = false;
            }
            if (*data_handle2 != 1) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (!data_handle2) {
                th3_ok = false;
            }
            if (*data_handle2 != 1) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}